

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatserver.cpp
# Opt level: O0

void __thiscall ChatServer::incomingConnection(ChatServer *this,qintptr socketDescriptor)

{
  ServerWorker *pSVar1;
  ulong uVar2;
  qsizetype qVar3;
  QThread *this_00;
  QThread **ppQVar4;
  difference_type dVar5;
  reference piVar6;
  const_reference ppQVar7;
  ConnectionType type;
  QArrayDataPointer<char16_t> local_1e0;
  QString local_1c8;
  code *local_1b0;
  undefined8 uStack_1a8;
  code *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  undefined8 local_180;
  ChatServer *local_178;
  code *local_170;
  qsizetype local_168;
  type local_160;
  undefined1 local_140 [16];
  QTcpSocket *local_130;
  ChatServer *local_128;
  code *local_120;
  qsizetype local_118;
  type local_110;
  undefined1 local_f0 [16];
  QTcpSocket *local_e0;
  ChatServer *local_d8;
  code *local_d0;
  qsizetype local_c8;
  type local_c0;
  undefined1 local_98 [16];
  QTcpSocket *pQStack_88;
  code *local_80;
  char16_t *local_78;
  Object local_70 [8];
  int *local_68;
  const_iterator local_60;
  int *local_58;
  const_iterator local_50;
  int local_48 [2];
  int threadIdx;
  ServerWorker *local_38;
  ServerWorker *worker;
  qintptr socketDescriptor_local;
  ChatServer *this_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  worker = (ServerWorker *)socketDescriptor;
  socketDescriptor_local = (qintptr)this;
  pSVar1 = (ServerWorker *)operator_new(0x38);
  ServerWorker::ServerWorker(pSVar1,(QObject *)0x0);
  local_38 = pSVar1;
  uVar2 = (**(code **)(*(long *)pSVar1 + 0x60))(pSVar1,worker);
  if ((uVar2 & 1) == 0) {
    QObject::deleteLater();
  }
  else {
    qVar3 = QList<QThread_*>::size(&this->m_availableThreads);
    local_48[0] = (int)qVar3;
    if (local_48[0] < this->m_idealThreadCount) {
      this_00 = (QThread *)operator_new(0x10);
      QThread::QThread(this_00,(QObject *)this);
      QList<QThread_*>::append(&this->m_availableThreads,this_00);
      QList<int>::append(&this->m_threadsLoad,1);
      ppQVar4 = QList<QThread_*>::last(&this->m_availableThreads);
      QThread::start(*ppQVar4,7);
    }
    else {
      local_50 = QList<int>::cbegin(&this->m_threadsLoad);
      local_60 = QList<int>::cbegin(&this->m_threadsLoad);
      local_68 = (int *)QList<int>::cend(&this->m_threadsLoad);
      local_58 = (int *)std::min_element<QList<int>::const_iterator>
                                  (local_60,(const_iterator)local_68);
      dVar5 = std::distance<QList<int>::const_iterator>(local_50,(const_iterator)local_58);
      local_48[0] = (int)dVar5;
      piVar6 = QList<int>::operator[](&this->m_threadsLoad,(long)local_48[0]);
      *piVar6 = *piVar6 + 1;
    }
    pSVar1 = local_38;
    QList<QThread_*>::at(&this->m_availableThreads,(long)local_48[0]);
    QObject::moveToThread((QThread *)pSVar1);
    ppQVar7 = QList<QThread_*>::at(&this->m_availableThreads,(long)local_48[0]);
    local_80 = QThread::finished;
    local_78 = (char16_t *)0x0;
    local_98._8_8_ = QObject::deleteLater;
    pQStack_88 = (QTcpSocket *)0x0;
    QObject::connect<void(QThread::*)(QThread::QPrivateSignal),void(QObject::*)()>
              (local_70,(offset_in_QThread_to_subr)*ppQVar7,(Object *)QThread::finished,0,
               (ConnectionType)local_38);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    pSVar1 = local_38;
    local_d0 = userDisconnected;
    local_c8 = 0;
    local_d8 = this;
    std::bind<void(ChatServer::*)(ServerWorker*,int),ChatServer*,ServerWorker*&,int&>
              (&local_c0,(offset_in_ChatServer_to_subr *)&local_d0,&local_d8,&local_38,local_48);
    local_f0._8_8_ = ServerWorker::disconnectedFromClient;
    local_e0 = (QTcpSocket *)0x0;
    type = (ConnectionType)this;
    QObject::
    connect<void(ServerWorker::*)(),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*,int))(ServerWorker*,int)>>
              ((Object *)local_98,(Function)pSVar1,(QObject *)ServerWorker::disconnectedFromClient,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_int))(ServerWorker_*,_int)>
                *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_98);
    pSVar1 = local_38;
    local_120 = userError;
    local_118 = 0;
    local_128 = this;
    std::bind<void(ChatServer::*)(ServerWorker*),ChatServer*,ServerWorker*&>
              (&local_110,(offset_in_ChatServer_to_subr *)&local_120,&local_128,&local_38);
    local_140._8_8_ = ServerWorker::error;
    local_130 = (QTcpSocket *)0x0;
    QObject::
    connect<void(ServerWorker::*)(),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*))(ServerWorker*)>>
              ((Object *)local_f0,(Function)pSVar1,(QObject *)ServerWorker::error,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*))(ServerWorker_*)> *)0x0,type
              );
    QMetaObject::Connection::~Connection((Connection *)local_f0);
    pSVar1 = local_38;
    local_170 = jsonReceived;
    local_168 = 0;
    local_178 = this;
    std::
    bind<void(ChatServer::*)(ServerWorker*,QJsonObject_const&),ChatServer*,ServerWorker*&,std::_Placeholder<1>const&>
              (&local_160,(offset_in_ChatServer_to_subr *)&local_170,&local_178,&local_38,
               (_Placeholder<1> *)&std::placeholders::_1);
    local_190._8_8_ = ServerWorker::jsonReceived;
    local_180._0_4_ = 0;
    local_180._4_4_ = 0;
    QObject::
    connect<void(ServerWorker::*)(QJsonObject_const&),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*,std::_Placeholder<1>))(ServerWorker*,QJsonObject_const&)>>
              ((Object *)local_140,(offset_in_ServerWorker_to_subr)pSVar1,
               (QObject *)ServerWorker::jsonReceived,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_std::_Placeholder<1>))(ServerWorker_*,_const_QJsonObject_&)>
                *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)local_140);
    local_1a0 = stopAllClients;
    local_198 = 0;
    local_1b0 = ServerWorker::disconnectFromClient;
    uStack_1a8 = 0;
    QObject::connect<void(ChatServer::*)(),void(ServerWorker::*)()>
              ((Object *)local_190,(offset_in_ChatServer_to_subr)this,(Object *)stopAllClients,0,
               (ConnectionType)local_38);
    QMetaObject::Connection::~Connection((Connection *)local_190);
    QList<ServerWorker_*>::append(&this->m_clients,local_38);
    str = L"New client Connected";
    this_local = (ChatServer *)anon_var_dwarf_14656;
    local_10 = &local_1e0;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_1e0,(Data *)0x0,L"New client Connected",0x14);
    QString::QString(&local_1c8,&local_1e0);
    logMessage(this,&local_1c8);
    QString::~QString(&local_1c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
  }
  return;
}

Assistant:

void ChatServer::incomingConnection(qintptr socketDescriptor)
{
    ServerWorker *worker = new ServerWorker;
    if (!worker->setSocketDescriptor(socketDescriptor)) {
        worker->deleteLater();
        return;
    }
    int threadIdx = m_availableThreads.size();
    if (threadIdx < m_idealThreadCount) { //we can add a new thread
        m_availableThreads.append(new QThread(this));
        m_threadsLoad.append(1);
        m_availableThreads.last()->start();
    } else {
        // find the thread with the least amount of clients and use it
        threadIdx = std::distance(m_threadsLoad.cbegin(), std::min_element(m_threadsLoad.cbegin(), m_threadsLoad.cend()));
        ++m_threadsLoad[threadIdx];
    }
    worker->moveToThread(m_availableThreads.at(threadIdx));
    connect(m_availableThreads.at(threadIdx), &QThread::finished, worker, &QObject::deleteLater);
    connect(worker, &ServerWorker::disconnectedFromClient, this, std::bind(&ChatServer::userDisconnected, this, worker, threadIdx));
    connect(worker, &ServerWorker::error, this, std::bind(&ChatServer::userError, this, worker));
    connect(worker, &ServerWorker::jsonReceived, this, std::bind(&ChatServer::jsonReceived, this, worker, std::placeholders::_1));
    connect(this, &ChatServer::stopAllClients, worker, &ServerWorker::disconnectFromClient);
    m_clients.append(worker);
    emit logMessage(QStringLiteral("New client Connected"));
}